

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O2

err_t g12sSign(octet *sig,g12s_params *params,octet *hash,octet *privkey,gen_i rng,void *rng_stack)

{
  u64 *dest;
  u32 uVar1;
  size_t sVar2;
  octet *buf;
  word *pwVar3;
  err_t eVar4;
  bool_t bVar5;
  int iVar6;
  ulong uVar7;
  word *a;
  u64 *dest_00;
  ec_o *ec_00;
  ulong n;
  uint uVar8;
  u64 *dest_01;
  void *pvVar9;
  ec_o *ec;
  void *local_78;
  octet *local_70;
  u64 *local_68;
  word *local_60;
  u64 *local_58;
  ulong local_50;
  word *local_48;
  ulong local_40;
  void *local_38;
  ulong count;
  
  ec = (ec_o *)0x0;
  eVar4 = 0x130;
  if ((rng != (gen_i)0x0) && (eVar4 = g12sEcCreate(&ec,params,g12sSign_deep), eVar4 == 0)) {
    uVar1 = params->l;
    uVar8 = uVar1 + 7 >> 3;
    count = (ulong)uVar8;
    local_70 = sig;
    bVar5 = memIsValid(hash,count);
    ec_00 = ec;
    if ((bVar5 != 0) && (bVar5 = memIsValid(privkey,count), ec_00 = ec, bVar5 != 0)) {
      local_40 = (ulong)(uVar8 * 2);
      bVar5 = memIsValid(local_70,local_40);
      ec_00 = ec;
      if (bVar5 != 0) {
        uVar8 = uVar1 + 0x3f >> 6;
        n = (ulong)uVar8;
        dest_01 = (u64 *)((long)&(ec->hdr).keep + (ec->hdr).keep);
        sVar2 = ec->f->n;
        local_38 = rng_stack;
        u64From(dest_01,privkey,count);
        bVar5 = wwIsZero(dest_01,n);
        if ((bVar5 != 0) || (iVar6 = wwCmp(dest_01,ec_00->order,n), -1 < iVar6)) {
          blobClose(ec_00);
          return 0x1f8;
        }
        uVar7 = (ulong)(uVar8 * 8);
        dest = (u64 *)((long)dest_01 + uVar7);
        a = (word *)(uVar7 + (long)dest);
        local_48 = (word *)((long)a + uVar7);
        dest_00 = local_48 + sVar2 * 2;
        local_60 = (word *)((long)dest_00 + uVar7);
        pvVar9 = (void *)(uVar7 + (long)local_60);
        local_58 = dest_01;
        memCopy(dest,hash,count);
        memRev(dest,count);
        u64From(dest,dest,count);
        zzMod(dest,dest,n,ec_00->order,n,pvVar9);
        bVar5 = wwIsZero(dest,n);
        pwVar3 = local_48;
        local_78 = pvVar9;
        local_68 = dest;
        local_50 = n;
        if (bVar5 != 0) {
          *dest = 1;
        }
        while( true ) {
          bVar5 = zzRandNZMod(a,ec_00->order,n,rng,local_38);
          pvVar9 = local_78;
          if (bVar5 == 0) {
            blobClose(ec_00);
            return 0x130;
          }
          bVar5 = ecMulA(pwVar3,ec_00->base,ec_00,a,n,local_78);
          if (bVar5 == 0) break;
          (*ec_00->f->to)((octet *)pwVar3,pwVar3,ec_00->f,pvVar9);
          u64From(dest_00,pwVar3,ec_00->f->no);
          n = local_50;
          zzMod(dest_00,dest_00,ec_00->f->n,ec_00->order,local_50,pvVar9);
          bVar5 = wwIsZero(dest_00,n);
          pvVar9 = local_78;
          if (bVar5 == 0) {
            zzMulMod(a,a,local_68,ec_00->order,n,local_78);
            pwVar3 = local_60;
            zzMulMod(local_60,dest_00,local_58,ec_00->order,n,pvVar9);
            zzAddMod(pwVar3,pwVar3,a,ec_00->order,n);
            buf = local_70;
            u64To(local_70,count,pwVar3);
            u64To(buf + count,count,dest_00);
            memRev(buf,local_40);
            blobClose(ec_00);
            return 0;
          }
        }
      }
    }
    blobClose(ec_00);
    eVar4 = 0x6d;
  }
  return eVar4;
}

Assistant:

err_t g12sSign(octet sig[], const g12s_params* params, const octet hash[],
	const octet privkey[], gen_i rng, void* rng_stack)
{
	err_t code;
	size_t m, mo;
	// состояние
	ec_o* ec = 0;
	word* d;		/* [m] личный ключ */
	word* e;		/* [m] обработанное хэш-значение */
	word* k;		/* [m] одноразовый ключ */
	word* C;		/* [2n] вспомогательная точка */
	word* r;		/* [m] первая (старшая) часть подписи */
	word* s;		/* [m] вторая часть подписи */
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = g12sEcCreate(&ec, params, g12sSign_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	m = W_OF_B(params->l);
	mo = O_OF_B(params->l);
	// проверить входные указатели
	if (!memIsValid(hash, mo) ||
		!memIsValid(privkey, mo) ||
		!memIsValid(sig, 2 * mo))
	{
		g12sEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	e = d + m;
	k = e + m;
	C = k + m;
	r = C + 2 * ec->f->n;
	s = r + m;
	stack = s + m;
	// загрузить d
	wwFrom(d, privkey, mo);
	if (wwIsZero(d, m) || 
		wwCmp(d, ec->order, m) >= 0)
	{
		g12sEcClose(ec);
		return ERR_BAD_PRIVKEY;
	}
	// e <- hash \mod q
	memCopy(e, hash, mo);
	memRev(e, mo);
	wwFrom(e, e, mo);
	zzMod(e, e, m, ec->order, m, stack);
	// e == 0 => e <- 1
	if (wwIsZero(e, m))
		e[0] = 1;
	// k <-R {1,2,..., q - 1}
gen_k:
	if (!zzRandNZMod(k, ec->order, m, rng, rng_stack))
	{
		g12sEcClose(ec);
		return ERR_BAD_RNG;
	}
	// C <- k P
	if (!ecMulA(C, ec->base, ec, k, m, stack))
	{
		// если params корректны, то этого быть не должно
		g12sEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// r <- x_C \mod q
	qrTo((octet*)C, ecX(C), ec->f, stack);
	wwFrom(r, C, ec->f->no);
	zzMod(r, r, ec->f->n, ec->order, m, stack);
	// r == 0 => повторить генерацию k
	if (wwIsZero(r, m))
		goto gen_k;
	// s <- (rd + ke) \mod q
	zzMulMod(k, k, e, ec->order, m, stack);
	zzMulMod(s, r, d, ec->order, m, stack);
	zzAddMod(s, s, k, ec->order, m);
	// выгрузить ЭЦП
	wwTo(sig, mo, s);
	wwTo(sig + mo, mo, r);
	memRev(sig, 2 * mo);
	// все нормально
	g12sEcClose(ec);
	return ERR_OK;
}